

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extend.c
# Opt level: O0

void highbd_copy_and_extend_plane
               (uint8_t *src8,int src_pitch,uint8_t *dst8,int dst_pitch,int w,int h,int extend_top,
               int extend_left,int extend_bottom,int extend_right)

{
  int iVar1;
  long lVar2;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  uint16_t *dst_ptr2;
  uint16_t *dst_ptr1;
  uint16_t *src_ptr2;
  uint16_t *src_ptr1;
  uint16_t *dst;
  uint16_t *src;
  int linesize;
  int i;
  void *local_60;
  void *local_58;
  ushort *local_50;
  ushort *local_48;
  int local_28;
  
  local_48 = (ushort *)(in_RDI * 2);
  lVar2 = in_RDX * 2;
  local_50 = local_48 + (long)in_R8D + -1;
  local_58 = (void *)(lVar2 + (long)(int)dst_ptr1 * -2);
  local_60 = (void *)(lVar2 + (long)in_R8D * 2);
  for (local_28 = 0; local_28 < in_R9D; local_28 = local_28 + 1) {
    aom_memset16(local_58,(uint)*local_48,(long)(int)dst_ptr1);
    memcpy((void *)((long)local_58 + (long)(int)dst_ptr1 * 2),local_48,(long)in_R8D << 1);
    aom_memset16(local_60,(uint)*local_50,(long)(int)src_ptr1);
    local_48 = local_48 + in_ESI;
    local_50 = local_50 + in_ESI;
    local_58 = (void *)((long)local_58 + (long)in_ECX * 2);
    local_60 = (void *)((long)local_60 + (long)in_ECX * 2);
  }
  local_58 = (void *)(lVar2 + (long)(in_ECX * -(int)dst_ptr2) * 2 + (long)(int)dst_ptr1 * -2);
  local_60 = (void *)(lVar2 + (long)(in_ECX * in_R9D) * 2 + (long)(int)dst_ptr1 * -2);
  iVar1 = (int)dst_ptr1 + (int)src_ptr1 + in_R8D;
  for (local_28 = 0; local_28 < (int)dst_ptr2; local_28 = local_28 + 1) {
    memcpy(local_58,(void *)(lVar2 + (long)(int)dst_ptr1 * -2),(long)iVar1 << 1);
    local_58 = (void *)((long)local_58 + (long)in_ECX * 2);
  }
  for (local_28 = 0; local_28 < (int)src_ptr2; local_28 = local_28 + 1) {
    memcpy(local_60,(void *)(lVar2 + (long)(in_ECX * (in_R9D + -1)) * 2 + (long)(int)dst_ptr1 * -2),
           (long)iVar1 << 1);
    local_60 = (void *)((long)local_60 + (long)in_ECX * 2);
  }
  return;
}

Assistant:

static void highbd_copy_and_extend_plane(const uint8_t *src8, int src_pitch,
                                         uint8_t *dst8, int dst_pitch, int w,
                                         int h, int extend_top, int extend_left,
                                         int extend_bottom, int extend_right) {
  int i, linesize;
  uint16_t *src = CONVERT_TO_SHORTPTR(src8);
  uint16_t *dst = CONVERT_TO_SHORTPTR(dst8);

  // copy the left and right most columns out
  const uint16_t *src_ptr1 = src;
  const uint16_t *src_ptr2 = src + w - 1;
  uint16_t *dst_ptr1 = dst - extend_left;
  uint16_t *dst_ptr2 = dst + w;

  for (i = 0; i < h; i++) {
    aom_memset16(dst_ptr1, src_ptr1[0], extend_left);
    memcpy(dst_ptr1 + extend_left, src_ptr1, w * sizeof(src_ptr1[0]));
    aom_memset16(dst_ptr2, src_ptr2[0], extend_right);
    src_ptr1 += src_pitch;
    src_ptr2 += src_pitch;
    dst_ptr1 += dst_pitch;
    dst_ptr2 += dst_pitch;
  }

  // Now copy the top and bottom lines into each line of the respective
  // borders
  src_ptr1 = dst - extend_left;
  src_ptr2 = dst + dst_pitch * (h - 1) - extend_left;
  dst_ptr1 = dst + dst_pitch * (-extend_top) - extend_left;
  dst_ptr2 = dst + dst_pitch * (h)-extend_left;
  linesize = extend_left + extend_right + w;
  assert(linesize <= dst_pitch);

  for (i = 0; i < extend_top; i++) {
    memcpy(dst_ptr1, src_ptr1, linesize * sizeof(src_ptr1[0]));
    dst_ptr1 += dst_pitch;
  }

  for (i = 0; i < extend_bottom; i++) {
    memcpy(dst_ptr2, src_ptr2, linesize * sizeof(src_ptr2[0]));
    dst_ptr2 += dst_pitch;
  }
}